

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StackIR.cpp
# Opt level: O0

void __thiscall wasm::StackIROptimizer::dce(StackIROptimizer *this)

{
  bool bVar1;
  size_type sVar2;
  reference ppSVar3;
  ulong uVar4;
  BasicType local_24;
  StackInst *local_20;
  StackInst *inst;
  Index i;
  bool inUnreachableCode;
  StackIROptimizer *this_local;
  
  inst._7_1_ = 0;
  _i = this;
  for (inst._0_4_ = 0; uVar4 = (ulong)(uint)inst,
      sVar2 = std::vector<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>::size(this->insts),
      uVar4 < sVar2; inst._0_4_ = (uint)inst + 1) {
    ppSVar3 = std::vector<wasm::StackInst_*,_std::allocator<wasm::StackInst_*>_>::operator[]
                        (this->insts,(ulong)(uint)inst);
    local_20 = *ppSVar3;
    if (local_20 != (StackInst *)0x0) {
      if ((inst._7_1_ & 1) == 0) {
        local_24 = unreachable;
        bVar1 = wasm::Type::operator==(&local_20->type,&local_24);
        if (bVar1) {
          inst._7_1_ = 1;
        }
      }
      else {
        bVar1 = isControlFlowBarrier(this,local_20);
        if (bVar1) {
          inst._7_1_ = 0;
        }
        else {
          removeAt(this,(uint)inst);
        }
      }
    }
  }
  return;
}

Assistant:

void dce() {
    bool inUnreachableCode = false;
    for (Index i = 0; i < insts.size(); i++) {
      auto* inst = insts[i];
      if (!inst) {
        continue;
      }
      if (inUnreachableCode) {
        // Does the unreachable code end here?
        if (isControlFlowBarrier(inst)) {
          inUnreachableCode = false;
        } else {
          // We can remove this.
          removeAt(i);
        }
      } else if (inst->type == Type::unreachable) {
        inUnreachableCode = true;
      }
    }
  }